

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O3

Error __thiscall asmjit::BaseBuilder::_newLabelNode(BaseBuilder *this,LabelNode **out)

{
  Error EVar1;
  LabelNode *node;
  BaseBuilder *unaff_RBX;
  LabelNode **unaff_R14;
  size_t sStack_18;
  
  *out = (LabelNode *)0x0;
  if ((this->_allocator)._zone == (Zone *)0x0) {
    _newLabelNode();
  }
  else {
    node = (LabelNode *)ZoneAllocator::_alloc(&this->_allocator,0x38,&sStack_18);
    unaff_RBX = this;
    unaff_R14 = out;
    if (node != (LabelNode *)0x0) {
      (node->super_BaseNode).field_0.field_0._prev = (BaseNode *)0x0;
      (node->super_BaseNode).field_0.field_0._next = (BaseNode *)0x0;
      (node->super_BaseNode).field_1._any._nodeType = '\x03';
      (node->super_BaseNode).field_1._any._nodeFlags = (byte)this->_nodeFlags | 0x50;
      *(undefined8 *)((long)&(node->super_BaseNode).field_1 + 2) = 0;
      *(undefined8 *)((long)&(node->super_BaseNode).field_3 + 2) = 0;
      *(undefined8 *)((long)&(node->super_BaseNode)._passData + 2) = 0;
      *(undefined8 *)((long)&(node->super_BaseNode)._inlineComment + 2) = 0;
      *(undefined2 *)((long)&node->_labelId + 2) = 0;
      *out = node;
      goto LAB_00111e5f;
    }
  }
  *unaff_R14 = (LabelNode *)0x0;
  EVar1 = BaseEmitter::reportError(&unaff_RBX->super_BaseEmitter,1,(char *)0x0);
  if (EVar1 != 0) {
    return EVar1;
  }
  node = *unaff_R14;
LAB_00111e5f:
  EVar1 = registerLabelNode(unaff_RBX,node);
  return EVar1;
}

Assistant:

Error BaseBuilder::_newLabelNode(LabelNode** out) {
  *out = nullptr;

  ASMJIT_PROPAGATE(_newNodeT<LabelNode>(out));
  return registerLabelNode(*out);
}